

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btUniversalConstraint.cpp
# Opt level: O0

void __thiscall
btUniversalConstraint::setAxis(btUniversalConstraint *this,btVector3 *axis1,btVector3 *axis2)

{
  undefined8 uVar1;
  btMatrix3x3 *xx;
  btMatrix3x3 *this_00;
  btScalar *yz;
  btScalar *pbVar2;
  btScalar *pbVar3;
  btScalar *pbVar4;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  btTransform *in_RDI;
  btVector3 bVar5;
  btTransform frameInW;
  btVector3 xAxis;
  btVector3 yAxis;
  btVector3 zAxis;
  btTransform *other;
  btTransform *in_stack_fffffffffffffe10;
  btGeneric6DofConstraint *this_01;
  btVector3 *in_stack_fffffffffffffe18;
  btTransform *in_stack_fffffffffffffe20;
  btTransform *t;
  btTransform *in_stack_fffffffffffffe78;
  btTransform local_90;
  btVector3 local_50;
  btVector3 local_40;
  btVector3 local_30 [2];
  
  uVar1 = in_RSI[1];
  *(undefined8 *)(in_RDI[0x15].m_basis.m_el[0].m_floats + 2) = *in_RSI;
  *(undefined8 *)in_RDI[0x15].m_basis.m_el[1].m_floats = uVar1;
  uVar1 = in_RDX[1];
  *(undefined8 *)(in_RDI[0x15].m_basis.m_el[1].m_floats + 2) = *in_RDX;
  *(undefined8 *)in_RDI[0x15].m_basis.m_el[2].m_floats = uVar1;
  bVar5 = btVector3::normalized(in_stack_fffffffffffffe18);
  local_30[0].m_floats._8_8_ = bVar5.m_floats._8_8_;
  local_30[0].m_floats._0_8_ = bVar5.m_floats._0_8_;
  bVar5 = btVector3::normalized(in_stack_fffffffffffffe18);
  local_40.m_floats._8_8_ = bVar5.m_floats._8_8_;
  local_40.m_floats._0_8_ = bVar5.m_floats._0_8_;
  bVar5 = btVector3::cross((btVector3 *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_50.m_floats._8_8_ = bVar5.m_floats._8_8_;
  local_50.m_floats._0_8_ = bVar5.m_floats._0_8_;
  btTransform::btTransform(in_stack_fffffffffffffe10);
  btTransform::setIdentity(in_stack_fffffffffffffe20);
  xx = btTransform::getBasis(&local_90);
  this_00 = (btMatrix3x3 *)btVector3::operator_cast_to_float_(&local_50);
  btVector3::operator_cast_to_float_(&local_40);
  yz = btVector3::operator_cast_to_float_(local_30);
  pbVar2 = btVector3::operator_cast_to_float_(&local_50);
  pbVar2 = pbVar2 + 1;
  pbVar3 = btVector3::operator_cast_to_float_(&local_40);
  pbVar3 = pbVar3 + 1;
  pbVar4 = btVector3::operator_cast_to_float_(local_30);
  other = (btTransform *)(pbVar4 + 1);
  pbVar4 = btVector3::operator_cast_to_float_(&local_50);
  this_01 = (btGeneric6DofConstraint *)(pbVar4 + 2);
  pbVar4 = btVector3::operator_cast_to_float_(&local_40);
  t = (btTransform *)(pbVar4 + 2);
  pbVar4 = btVector3::operator_cast_to_float_(local_30);
  btMatrix3x3::setValue
            (this_00,(btScalar *)xx,pbVar4 + 2,(btScalar *)t,(btScalar *)this_01,(btScalar *)other,
             yz,pbVar2,pbVar3,(btScalar *)this_01);
  btTransform::setOrigin(&local_90,(btVector3 *)(in_RDI[0x14].m_origin.m_floats + 2));
  btRigidBody::getCenterOfMassTransform(*(btRigidBody **)((in_RDI->m_basis).m_el[2].m_floats + 2));
  btTransform::inverse(in_stack_fffffffffffffe78);
  btTransform::operator*(in_RDI,t);
  btTransform::operator=((btTransform *)this_01,other);
  btRigidBody::getCenterOfMassTransform(*(btRigidBody **)(in_RDI->m_origin).m_floats);
  btTransform::inverse(in_stack_fffffffffffffe78);
  btTransform::operator*(in_RDI,t);
  btTransform::operator=((btTransform *)this_01,other);
  btGeneric6DofConstraint::calculateTransforms(this_01);
  return;
}

Assistant:

void btUniversalConstraint::setAxis(const btVector3& axis1,const btVector3& axis2)
{
  m_axis1 = axis1;
  m_axis2 = axis2;

	btVector3 zAxis = axis1.normalized();
	btVector3 yAxis = axis2.normalized();
	btVector3 xAxis = yAxis.cross(zAxis); // we want right coordinate system

	btTransform frameInW;
	frameInW.setIdentity();
	frameInW.getBasis().setValue(	xAxis[0], yAxis[0], zAxis[0],	
                                xAxis[1], yAxis[1], zAxis[1],
                                xAxis[2], yAxis[2], zAxis[2]);
	frameInW.setOrigin(m_anchor);

	// now get constraint frame in local coordinate systems
	m_frameInA = m_rbA.getCenterOfMassTransform().inverse() * frameInW;
	m_frameInB = m_rbB.getCenterOfMassTransform().inverse() * frameInW;

  calculateTransforms();
}